

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# migrate.cpp
# Opt level: O0

bool __thiscall wallet::BerkeleyRODatabase::Backup(BerkeleyRODatabase *this,string *dest)

{
  bool bVar1;
  byte bVar2;
  long in_FS_OFFSET;
  filesystem_error *e;
  path dst;
  path src;
  undefined4 in_stack_fffffffffffffdc8;
  undefined4 uVar3;
  undefined2 in_stack_fffffffffffffdcc;
  copy_options in_stack_fffffffffffffdce;
  path *in_stack_fffffffffffffdd0;
  path *in_stack_fffffffffffffdd8;
  char *in_stack_fffffffffffffde0;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffde8;
  string *in_stack_fffffffffffffdf8;
  LogFlags in_stack_fffffffffffffe30;
  char *flag;
  int in_stack_fffffffffffffe3c;
  bool local_1a1;
  ConstevalFormatString<2U> in_stack_fffffffffffffe78;
  string_view in_stack_fffffffffffffe80;
  string_view in_stack_fffffffffffffe90;
  Level in_stack_ffffffffffffff70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff88;
  path local_58;
  path local_30;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  fs::path::path((path *)CONCAT26(in_stack_fffffffffffffdce,
                                  CONCAT24(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8)),
                 (path *)0x37f7aa);
  fs::PathFromString(in_stack_fffffffffffffdf8);
  bVar1 = std::filesystem::is_directory(in_stack_fffffffffffffdd8);
  if (bVar1) {
    BDBDataFile((path *)in_stack_fffffffffffffdf8);
    fs::path::operator=((path *)in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
    fs::path::~path((path *)CONCAT26(in_stack_fffffffffffffdce,
                                     CONCAT24(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8)))
    ;
  }
  bVar1 = fs::exists((path *)CONCAT26(in_stack_fffffffffffffdce,
                                      CONCAT24(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8))
                    );
  if ((bVar1) && (bVar2 = std::filesystem::equivalent(&local_30,&local_58), (bVar2 & 1) != 0)) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
    flag = "cannot backup to wallet source file %s\n";
    fs::PathToString_abi_cxx11_(in_stack_fffffffffffffdd0);
    uVar3 = 2;
    LogPrintFormatInternal<std::__cxx11::string>
              (in_stack_fffffffffffffe90,in_stack_fffffffffffffe80,in_stack_fffffffffffffe3c,
               (LogFlags)flag,in_stack_ffffffffffffff70,
               (ConstevalFormatString<1U>)in_stack_fffffffffffffe78.fmt,in_stack_ffffffffffffff80);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT26(in_stack_fffffffffffffdce,CONCAT24(in_stack_fffffffffffffdcc,uVar3)));
    local_1a1 = false;
  }
  else {
    fs::copy_file((path *)in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,
                  in_stack_fffffffffffffdce);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
    fs::PathToString_abi_cxx11_(in_stack_fffffffffffffdd0);
    fs::PathToString_abi_cxx11_(in_stack_fffffffffffffdd0);
    uVar3 = 2;
    LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string>
              (in_stack_fffffffffffffe90,in_stack_fffffffffffffe80,in_stack_fffffffffffffe3c,
               in_stack_fffffffffffffe30,in_stack_ffffffffffffff70,in_stack_fffffffffffffe78,
               in_stack_ffffffffffffff80,in_stack_ffffffffffffff88);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT26(in_stack_fffffffffffffdce,CONCAT24(in_stack_fffffffffffffdcc,uVar3)));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT26(in_stack_fffffffffffffdce,CONCAT24(in_stack_fffffffffffffdcc,uVar3)));
    local_1a1 = true;
  }
  fs::path::~path((path *)CONCAT26(in_stack_fffffffffffffdce,
                                   CONCAT24(in_stack_fffffffffffffdcc,uVar3)));
  fs::path::~path((path *)CONCAT26(in_stack_fffffffffffffdce,
                                   CONCAT24(in_stack_fffffffffffffdcc,uVar3)));
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_1a1;
}

Assistant:

bool BerkeleyRODatabase::Backup(const std::string& dest) const
{
    fs::path src(m_filepath);
    fs::path dst(fs::PathFromString(dest));

    if (fs::is_directory(dst)) {
        dst = BDBDataFile(dst);
    }
    try {
        if (fs::exists(dst) && fs::equivalent(src, dst)) {
            LogPrintf("cannot backup to wallet source file %s\n", fs::PathToString(dst));
            return false;
        }

        fs::copy_file(src, dst, fs::copy_options::overwrite_existing);
        LogPrintf("copied %s to %s\n", fs::PathToString(m_filepath), fs::PathToString(dst));
        return true;
    } catch (const fs::filesystem_error& e) {
        LogPrintf("error copying %s to %s - %s\n", fs::PathToString(m_filepath), fs::PathToString(dst), fsbridge::get_filesystem_error_message(e));
        return false;
    }
}